

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O3

void M_SetEntry(Matrix *M,size_t RoC,size_t Entry,size_t Pos,Real Val)

{
  ElType *pEVar1;
  LASErrIdType LVar2;
  
  LVar2 = LASResult();
  if (LVar2 == LASOK) {
    if (RoC == 0 || M->ElOrder != Rowws) {
      if ((((M->ElOrder != Clmws || RoC == 0) || (Pos == 0)) || (M->ClmDim < RoC)) ||
         ((M->RowDim < Pos || (M->Len[RoC] <= Entry)))) goto LAB_001117a3;
    }
    else if ((Pos == 0) || ((M->RowDim < RoC || (M->ClmDim < Pos)))) {
LAB_001117a3:
      LASError(LASRangeErr,"M_SetEntry",M->Name,(char *)0x0,(char *)0x0);
      return;
    }
    pEVar1 = M->El[RoC];
    pEVar1[Entry].Val = Val;
    pEVar1[Entry].Pos = Pos;
  }
  return;
}

Assistant:

void M_SetEntry(Matrix *M, size_t RoC, size_t Entry, size_t Pos, Real Val)
/* set a new matrix entry */
{
    if (LASResult() == LASOK) {
        if ((M->ElOrder == Rowws && RoC > 0 && RoC <= M->RowDim && Pos > 0 && Pos <= M->ClmDim) ||
            ((M->ElOrder == Clmws && RoC > 0 && RoC <= M->ClmDim && Pos > 0 && Pos <= M->RowDim) &&
            (Entry < M->Len[RoC]))) {
            M->El[RoC][Entry].Val = Val;
            M->El[RoC][Entry].Pos = Pos;
        } else {
            LASError(LASRangeErr, "M_SetEntry", M->Name, NULL, NULL);
        }
    }
}